

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_acolyte.cpp
# Opt level: O3

int AF_A_AcolyteDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  undefined4 extraout_var_00;
  long lVar5;
  PClass *pPVar6;
  DThinker *pDVar7;
  uint uVar8;
  DThinker *pDVar9;
  VMValue *pVVar10;
  char *__assertion;
  player_t *this;
  bool bVar11;
  bool bVar12;
  TThinkerIterator<AActor> iterator;
  FSoundID local_44;
  FThinkerIterator local_40;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f14a4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f1494;
  pDVar9 = (DThinker *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pDVar9 == (DThinker *)0x0) goto LAB_005f12ba;
    pPVar4 = (pDVar9->super_DObject).Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(pDVar9->super_DObject)._vptr_DObject)(pDVar9);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pDVar9->super_DObject).Class = pPVar4;
    }
    bVar11 = pPVar4 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    bVar12 = pPVar4 == pPVar6;
    if (!bVar12 && !bVar11) {
      do {
        pPVar4 = pPVar4->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
        if (pPVar4 == pPVar6) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    pVVar10 = (VMValue *)(ulong)(bVar12 || bVar11);
    uVar8 = (uint)bVar11;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005f14a4;
    }
  }
  else {
    if (pDVar9 != (DThinker *)0x0) goto LAB_005f1494;
LAB_005f12ba:
    pDVar9 = (DThinker *)0x0;
    pVVar10 = param;
    uVar8 = numparam;
  }
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005f137a;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005f1494:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005f14a4;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar4 = (PClass *)puVar2[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar10,uVar8,ret);
          puVar2[1] = pPVar4;
        }
        bVar11 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar6 && bVar11) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar11 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar6) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f14a4;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005f1494;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f137a:
    *(FRenderStyle *)&pDVar9[4].super_DObject.Class = LegacyRenderStyles[1];
    pPVar6 = (pDVar9->super_DObject).Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar3 = (**(pDVar9->super_DObject)._vptr_DObject)(pDVar9);
      pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar3);
      (pDVar9->super_DObject).Class = pPVar6;
    }
    if ((pPVar6->super_PStruct).super_PNamedType.TypeName.Index == 0x74) {
      this = (player_t *)&players;
      lVar5 = 0;
      do {
        if ((playeringame[lVar5] == true) && (0 < this->health)) {
          local_40.m_ParentType._0_4_ = 0x74;
          pPVar6 = PClass::FindClass((FName *)&local_40);
          FThinkerIterator::FThinkerIterator(&local_40,pPVar6,0x80);
          pDVar7 = FThinkerIterator::Next(&local_40);
          if (pDVar7 != (DThinker *)0x0) {
            do {
              if ((pDVar7 != pDVar9) && (0 < *(int *)((long)&pDVar7[8].super_DObject.Class + 4))) {
                return 0;
              }
              pDVar7 = FThinkerIterator::Next(&local_40);
            } while (pDVar7 != (DThinker *)0x0);
          }
          AActor::GiveInventoryType(&this->mo->super_AActor,QuestItemClasses[6]);
          player_t::SetLogNumber(this,0xe);
          S_StopSound(2);
          local_44.ID = S_FindSound("svox/voc14");
          S_Sound(2,&local_44,1.0,1.0);
          return 0;
        }
        lVar5 = lVar5 + 1;
        this = this + 1;
      } while (lVar5 != 8);
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005f14a4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_AcolyteDie)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	// [RH] Disable translucency here.
	self->RenderStyle = STYLE_Normal;

	// Only the Blue Acolyte does extra stuff on death.
	if (self->GetClass()->TypeName != NAME_AcolyteBlue)
		return 0;

	// Make sure somebody is still alive
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].health > 0)
			break;
	}
	if (i == MAXPLAYERS)
		return 0;

	// Make sure all the other blue acolytes are dead.
	TThinkerIterator<AActor> iterator(NAME_AcolyteBlue);
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != self && other->health > 0)
		{ // Found a living one
			return 0;
		}
	}

	players[i].mo->GiveInventoryType (QuestItemClasses[6]);
	players[i].SetLogNumber (14);
	S_StopSound (CHAN_VOICE);
	S_Sound (CHAN_VOICE, "svox/voc14", 1, ATTN_NORM);
	return 0;
}